

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionMessageTest.cpp
# Opt level: O2

void __thiscall
AssertionMessageTest_stdManipulatorTest_Test::TestBody
          (AssertionMessageTest_stdManipulatorTest_Test *this)

{
  AssertionMessage *pAVar1;
  char *message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  uint32_t n;
  AssertionResult gtest_ar;
  string local_48;
  string expectedMessage;
  
  n = 0x14;
  std::__cxx11::string::string((string *)&expectedMessage,"0x14\n",(allocator *)&local_48);
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_70);
  pAVar1 = cppassert::internal::AssertionMessage::operator<<((AssertionMessage *)&local_70,std::hex)
  ;
  pAVar1 = cppassert::internal::AssertionMessage::operator<<(pAVar1,std::showbase);
  pAVar1 = cppassert::internal::AssertionMessage::operator<<(pAVar1,&n);
  cppassert::internal::AssertionMessage::operator<<(pAVar1,std::endl<char,std::char_traits<char>>);
  cppassert::internal::AssertionMessage::str_abi_cxx11_(&local_48,(AssertionMessage *)&local_70);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"expectedMessage","message.str()",&expectedMessage,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionMessageTest.cpp"
               ,100,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&expectedMessage);
  return;
}

Assistant:

TEST(AssertionMessageTest, stdManipulatorTest)
{
    std::uint32_t n = 20;
    const std::string expectedMessage("0x14\n");
    cppassert::internal::AssertionMessage message;
    message<<std::hex<<std::showbase<<n<<std::endl;
    EXPECT_EQ(expectedMessage, message.str());
}